

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O1

int Abc_NtkFastExtract(Abc_Ntk_t *pNtk,Fxu_Data_t *p)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Abc_Obj_t *pAVar11;
  long lVar12;
  char *__s;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                  ,0x55,"int Abc_NtkFastExtract(Abc_Ntk_t *, Fxu_Data_t *)");
  }
  iVar4 = Abc_NtkToSop(pNtk,-1,1000000000);
  if (iVar4 == 0) {
    iVar4 = 0;
    __s = "Abc_NtkFastExtract(): Converting to SOPs has failed.";
  }
  else {
    lVar7 = (long)pNtk->vObjs->nSize;
    if (0 < lVar7) {
      lVar12 = 0;
      __s = 
      "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.";
      do {
        plVar1 = (long *)pNtk->vObjs->pArray[lVar12];
        if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
           (uVar13 = (ulong)*(int *)((long)plVar1 + 0x1c), 0 < (long)uVar13)) {
          lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          uVar14 = 0;
          do {
            if ((uVar14 < 2) &&
               (((uint)(uVar14 != 0) * 0x400 + 0x400 & *(uint *)((long)plVar1 + 0x14)) != 0)) {
LAB_00269b84:
              iVar4 = 0;
              goto LAB_00269f33;
            }
            uVar15 = 0;
            do {
              if ((uVar14 != uVar15) &&
                 (*(long *)(lVar2 + (long)*(int *)(plVar1[4] + uVar14 * 4) * 8) ==
                  *(long *)(lVar2 + (long)*(int *)(plVar1[4] + uVar15 * 4) * 8))) goto LAB_00269b84;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar13);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar7);
    }
    Abc_NtkCleanup(pNtk,0);
    p->pManSop = (Mem_Flex_t *)pNtk->pManFunc;
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nCap = 0;
    pVVar8->nSize = 0;
    pVVar8->pArray = (void **)0x0;
    p->vSops = pVVar8;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nCap = 0;
    pVVar9->nSize = 0;
    pVVar9->pArray = (void **)0x0;
    p->vFanins = pVVar9;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nCap = 0;
    pVVar9->nSize = 0;
    pVVar9->pArray = (void **)0x0;
    p->vSopsNew = pVVar9;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nCap = 0;
    pVVar9->nSize = 0;
    pVVar9->pArray = (void **)0x0;
    p->vFaninsNew = pVVar9;
    uVar5 = pNtk->vObjs->nSize;
    if (pVVar8->nCap < (int)uVar5) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((long)(int)uVar5 << 3);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar8->pArray,(long)(int)uVar5 << 3);
      }
      pVVar8->pArray = ppvVar10;
      pVVar8->nCap = uVar5;
    }
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        pVVar8->pArray[uVar13] = (void *)0x0;
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    pVVar8->nSize = uVar5;
    pVVar8 = p->vFanins;
    uVar5 = pNtk->vObjs->nSize;
    if (pVVar8->nCap < (int)uVar5) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((long)(int)uVar5 << 3);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar8->pArray,(long)(int)uVar5 << 3);
      }
      pVVar8->pArray = ppvVar10;
      pVVar8->nCap = uVar5;
    }
    if (0 < (int)uVar5) {
      uVar13 = 0;
      do {
        pVVar8->pArray[uVar13] = (void *)0x0;
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    pVVar8->nSize = uVar5;
    pVVar8 = p->vSopsNew;
    uVar13 = (long)p->nNodesExt + (long)pNtk->vObjs->nSize;
    iVar4 = (int)uVar13;
    if (pVVar8->nCap < iVar4) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(uVar13 * 8);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar8->pArray,uVar13 * 8);
      }
      pVVar8->pArray = ppvVar10;
      pVVar8->nCap = iVar4;
    }
    if (0 < iVar4) {
      uVar14 = 0;
      do {
        pVVar8->pArray[uVar14] = (void *)0x0;
        uVar14 = uVar14 + 1;
      } while ((uVar13 & 0xffffffff) != uVar14);
    }
    pVVar8->nSize = iVar4;
    pVVar8 = p->vFaninsNew;
    uVar13 = (long)p->nNodesExt + (long)pNtk->vObjs->nSize;
    iVar4 = (int)uVar13;
    if (pVVar8->nCap < iVar4) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(uVar13 * 8);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar8->pArray,uVar13 * 8);
      }
      pVVar8->pArray = ppvVar10;
      pVVar8->nCap = iVar4;
    }
    if (0 < iVar4) {
      uVar14 = 0;
      do {
        pVVar8->pArray[uVar14] = (void *)0x0;
        uVar14 = uVar14 + 1;
      } while ((uVar13 & 0xffffffff) != uVar14);
    }
    pVVar8->nSize = iVar4;
    pVVar8 = pNtk->vObjs;
    iVar4 = pVVar8->nSize;
    if (0 < iVar4) {
      lVar7 = 0;
      do {
        pvVar3 = pVVar8->pArray[lVar7];
        if ((((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) &&
            (iVar4 = Abc_SopGetVarNum(*(char **)((long)pvVar3 + 0x38)), 1 < iVar4)) &&
           (iVar4 = Abc_SopGetCubeNum(*(char **)((long)pvVar3 + 0x38)), 0 < iVar4)) {
          p->vSops->pArray[lVar7] = *(void **)((long)pvVar3 + 0x38);
          p->vFanins->pArray[lVar7] = (void *)((long)pvVar3 + 0x18);
        }
        lVar7 = lVar7 + 1;
        pVVar8 = pNtk->vObjs;
        iVar4 = pVVar8->nSize;
      } while (lVar7 < iVar4);
    }
    p->nNodesOld = iVar4;
    iVar4 = Fxu_FastExtract(p);
    if (iVar4 < 1) {
      iVar4 = 0;
      __s = "Warning: The network has not been changed by \"fx\".";
    }
    else {
      iVar4 = p->vFanins->nSize;
      if (p->vFaninsNew->nSize <= iVar4) {
        __assert_fail("p->vFanins->nSize < p->vFaninsNew->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                      ,0xf0,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
      }
      if (0 < p->nNodesNew) {
        do {
          pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
          if (iVar4 != pAVar11->Id) {
            __assert_fail("i == (int)pNode->Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                          ,0xf6,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < p->nNodesNew + p->vFanins->nSize);
      }
      uVar5 = p->vFanins->nSize;
      if (0 < (int)uVar5) {
        lVar7 = 0;
        do {
          if (p->vFaninsNew->pArray[lVar7] != (void *)0x0) {
            if (pNtk->vObjs->nSize <= lVar7) goto LAB_00269f49;
            pAVar11 = (Abc_Obj_t *)pNtk->vObjs->pArray[lVar7];
            Abc_ObjRemoveFanins(pAVar11);
            pvVar3 = p->vFaninsNew->pArray[lVar7];
            if (0 < *(int *)((long)pvVar3 + 4)) {
              lVar12 = 0;
              do {
                iVar4 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar12 * 4);
                if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) goto LAB_00269f49;
                Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar4]);
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)pvVar3 + 4));
            }
            pvVar3 = p->vSopsNew->pArray[lVar7];
            (pAVar11->field_5).pData = pvVar3;
            if (pvVar3 == (void *)0x0) {
              __assert_fail("pNode->pData != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                            ,0x10a,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
            }
          }
          lVar7 = lVar7 + 1;
          uVar5 = p->vFanins->nSize;
        } while (lVar7 < (int)uVar5);
      }
      if ((int)uVar5 < p->nNodesNew + p->vFanins->nSize) {
        if ((int)uVar5 < 0) {
LAB_00269f49:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar13 = (ulong)uVar5;
        do {
          if (pNtk->vObjs->nSize <= (int)uVar13) goto LAB_00269f49;
          pAVar11 = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar13];
          pvVar3 = p->vFaninsNew->pArray[uVar13];
          if (0 < *(int *)((long)pvVar3 + 4)) {
            lVar7 = 0;
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar7 * 4);
              if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) goto LAB_00269f49;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar4]);
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)((long)pvVar3 + 4));
          }
          pvVar3 = p->vSopsNew->pArray[uVar13];
          (pAVar11->field_5).pData = pvVar3;
          if (pvVar3 == (void *)0x0) {
            __assert_fail("pNode->pData != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                          ,0x119,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
          }
          uVar13 = uVar13 + 1;
        } while ((int)uVar13 < p->nNodesNew + p->vFanins->nSize);
      }
      iVar6 = Abc_NtkCheck(pNtk);
      iVar4 = 1;
      if (iVar6 != 0) {
        return 1;
      }
      __s = "Abc_NtkFastExtract: The network check has failed.";
    }
  }
LAB_00269f33:
  puts(__s);
  return iVar4;
}

Assistant:

int Abc_NtkFastExtract( Abc_Ntk_t * pNtk, Fxu_Data_t * p )
{
    assert( Abc_NtkIsLogic(pNtk) );
    // if the network is already in the SOP form, it may come from BLIF file
    // and it may not be SCC-free, in which case FXU will not work correctly
    if ( Abc_NtkIsSopLogic(pNtk) )
    { // to make sure the SOPs are SCC-free
//        Abc_NtkSopToBdd(pNtk);
//        Abc_NtkBddToSop(pNtk);
    }
    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        printf( "Abc_NtkFastExtract(): Converting to SOPs has failed.\n" );
        return 0;
    }
    // check if the network meets the requirements
    if ( !Abc_NtkFxuCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.\n" );
        return 0;
    }
    // sweep removes useless nodes
    Abc_NtkCleanup( pNtk, 0 );
    // collect information about the covers
    Abc_NtkFxuCollectInfo( pNtk, p );
    // call the fast extract procedure
    if ( Fxu_FastExtract(p) > 0 )
    {
        // update the network
        Abc_NtkFxuReconstruct( pNtk, p );
        // make sure everything is okay
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFastExtract: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    return 0;
}